

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

TypedAttribute<Imf_3_4::Rational> *
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::cast(Attribute *attribute)

{
  TypedAttribute<Imf_3_4::Rational> *pTVar1;
  TypeExc *this;
  
  if (attribute == (Attribute *)0x0) {
    pTVar1 = (TypedAttribute<Imf_3_4::Rational> *)0x0;
  }
  else {
    pTVar1 = (TypedAttribute<Imf_3_4::Rational> *)
             __dynamic_cast(attribute,&Attribute::typeinfo,&typeinfo,0);
  }
  if (pTVar1 != (TypedAttribute<Imf_3_4::Rational> *)0x0) {
    return pTVar1;
  }
  this = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::TypeExc::TypeExc(this,"Unexpected attribute type.");
  __cxa_throw(this,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
}

Assistant:

TypedAttribute<T>*
TypedAttribute<T>::cast (Attribute* attribute)
{
    TypedAttribute<T>* t = dynamic_cast<TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}